

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rank.cc
# Opt level: O0

void __thiscall
rank::Rank::Rank(Rank *this,vector<rank::KeyValue,_std::allocator<rank::KeyValue>_> *key_values)

{
  bool bVar1;
  size_type __n;
  Entry local_60;
  reference local_48;
  KeyValue *kv;
  const_iterator __end1;
  const_iterator __begin1;
  vector<rank::KeyValue,_std::allocator<rank::KeyValue>_> *__range1;
  vector<rank::KeyValue,_std::allocator<rank::KeyValue>_> *key_values_local;
  Rank *this_local;
  
  this->_dirty = true;
  std::vector<rank::Entry,_std::allocator<rank::Entry>_>::vector(&this->_entries);
  this->_dirty = true;
  __n = std::vector<rank::KeyValue,_std::allocator<rank::KeyValue>_>::size(key_values);
  std::vector<rank::Entry,_std::allocator<rank::Entry>_>::reserve(&this->_entries,__n);
  __end1 = std::vector<rank::KeyValue,_std::allocator<rank::KeyValue>_>::begin(key_values);
  kv = (KeyValue *)std::vector<rank::KeyValue,_std::allocator<rank::KeyValue>_>::end(key_values);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_rank::KeyValue_*,_std::vector<rank::KeyValue,_std::allocator<rank::KeyValue>_>_>
                                *)&kv);
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<const_rank::KeyValue_*,_std::vector<rank::KeyValue,_std::allocator<rank::KeyValue>_>_>
               ::operator*(&__end1);
    Entry::Entry(&local_60,*local_48);
    std::vector<rank::Entry,_std::allocator<rank::Entry>_>::push_back(&this->_entries,&local_60);
    __gnu_cxx::
    __normal_iterator<const_rank::KeyValue_*,_std::vector<rank::KeyValue,_std::allocator<rank::KeyValue>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

Rank::Rank(const std::vector<KeyValue>& key_values) {
        _dirty = true;
        _entries.reserve(key_values.size());
        for (auto &kv: key_values) { _entries.push_back(kv); }
    }